

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O0

int Abc_SclCheckOverlap(Abc_Ntk_t *pNtk,Vec_Int_t *vNodes)

{
  int iVar1;
  Abc_Obj_t *p;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNodes);
    if (iVar1 <= local_2c) {
      return 0;
    }
    iVar1 = Vec_IntEntry(vNodes,local_2c);
    p = Abc_NtkObj(pNtk,iVar1);
    if ((p != (Abc_Obj_t *)0x0) && (iVar1 = Abc_NodeIsTravIdCurrent(p), iVar1 != 0)) break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

int Abc_SclCheckOverlap( Abc_Ntk_t * pNtk, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            return 1;
    return 0;
}